

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_parameter_validation.cpp
# Opt level: O0

ze_result_t __thiscall
validation_layer::ZESParameterValidation::zesOverclockGetControlStatePrologue
          (ZESParameterValidation *this,zes_overclock_handle_t hDomainHandle,
          zes_overclock_control_t DomainControl,zes_control_state_t *pControlState,
          zes_pending_action_t *pPendingAction)

{
  zes_pending_action_t *pPendingAction_local;
  zes_control_state_t *pControlState_local;
  zes_overclock_control_t DomainControl_local;
  zes_overclock_handle_t hDomainHandle_local;
  ZESParameterValidation *this_local;
  
  if (hDomainHandle == (zes_overclock_handle_t)0x0) {
    this_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  }
  else if ((int)DomainControl < 0x801) {
    if (pControlState == (zes_control_state_t *)0x0) {
      this_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
    }
    else if (pPendingAction == (zes_pending_action_t *)0x0) {
      this_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
    }
    else {
      this_local._4_4_ = ZE_RESULT_SUCCESS;
    }
  }
  else {
    this_local._4_4_ = ZE_RESULT_ERROR_INVALID_ENUMERATION;
  }
  return this_local._4_4_;
}

Assistant:

ze_result_t
    ZESParameterValidation::zesOverclockGetControlStatePrologue(
        zes_overclock_handle_t hDomainHandle,           ///< [in] Handle for the component domain.
        zes_overclock_control_t DomainControl,          ///< [in] Domain Control.
        zes_control_state_t* pControlState,             ///< [out] Current overclock control state.
        zes_pending_action_t* pPendingAction            ///< [out] Pending overclock setting.
        )
    {
        if( nullptr == hDomainHandle )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( ZES_OVERCLOCK_CONTROL_ACM_DISABLE < DomainControl )
            return ZE_RESULT_ERROR_INVALID_ENUMERATION;

        if( nullptr == pControlState )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( nullptr == pPendingAction )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        return ZE_RESULT_SUCCESS;
    }